

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O3

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadGeometry(OgreBinarySerializer *this,VertexData *dest)

{
  StreamReader<false,_false> *this_00;
  unsigned_short uVar1;
  uint uVar2;
  int iVar3;
  Logger *this_01;
  MemoryStreamReader *this_02;
  long *local_1c0;
  long local_1b0 [2];
  undefined1 local_1a0 [376];
  
  uVar2 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
  (dest->super_IVertexData).count = uVar2;
  this_01 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[25]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
             (char (*) [25])"  - Reading geometry of ");
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0," vertices",9);
  std::__cxx11::stringbuf::str();
  Logger::debug(this_01,(char *)local_1c0);
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0,local_1b0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  this_00 = this->m_reader;
  if (*(int *)&this_00->end != *(int *)&this_00->current) {
    uVar1 = StreamReader<false,_false>::Get<unsigned_short>(this_00);
    uVar2 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
    this->m_currentLen = uVar2;
    this_02 = this->m_reader;
    if (*(int *)&this_02->end != *(int *)&this_02->current) {
      do {
        if (uVar1 == 0x5100) {
          ReadGeometryVertexDeclaration(this,dest);
        }
        else {
          if (uVar1 != 0x5200) {
            StreamReader<false,_false>::IncPtr(this_02,-6);
            return;
          }
          ReadGeometryVertexBuffer(this,dest);
        }
        this_02 = this->m_reader;
        iVar3 = (int)this_02->end - (int)this_02->current;
        if (iVar3 != 0) {
          uVar1 = StreamReader<false,_false>::Get<unsigned_short>(this_02);
          uVar2 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
          this->m_currentLen = uVar2;
          this_02 = this->m_reader;
          iVar3 = (int)this_02->end - (int)this_02->current;
        }
      } while (iVar3 != 0);
    }
  }
  return;
}

Assistant:

void OgreBinarySerializer::ReadGeometry(VertexData *dest)
{
    dest->count = Read<uint32_t>();

    ASSIMP_LOG_DEBUG_F( "  - Reading geometry of ", dest->count, " vertices");

    if (!AtEnd())
    {
        uint16_t id = ReadHeader();
        while (!AtEnd() &&
            (id == M_GEOMETRY_VERTEX_DECLARATION ||
             id == M_GEOMETRY_VERTEX_BUFFER))
        {
            switch(id)
            {
                case M_GEOMETRY_VERTEX_DECLARATION:
                {
                    ReadGeometryVertexDeclaration(dest);
                    break;
                }
                case M_GEOMETRY_VERTEX_BUFFER:
                {
                    ReadGeometryVertexBuffer(dest);
                    break;
                }
            }

            if (!AtEnd())
                id = ReadHeader();
        }
        if (!AtEnd())
            RollbackHeader();
    }
}